

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O1

ostream * deqp::gles31::Functional::operator<<(ostream *str,HexBool *v)

{
  ostream *poVar1;
  char *pcVar2;
  bool bVar3;
  Hex<8UL> local_18;
  
  bVar3 = v->value == 0;
  pcVar2 = "true";
  if (bVar3) {
    pcVar2 = "false";
  }
  std::__ostream_insert<char,std::char_traits<char>>(str,pcVar2,(ulong)bVar3 | 4);
  std::__ostream_insert<char,std::char_traits<char>>(str," / ",3);
  local_18.value = (deUint64)v->value;
  poVar1 = tcu::Format::Hex<8UL>::toStream(&local_18,str);
  return poVar1;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const HexBool& v)
{
	return str << (v.value ? "true" : "false") << " / " << tcu::toHex(v.value);
}